

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

void fsnav_linal_u_mul(double *res,double *u,double *v,size_t n,size_t m)

{
  double *pdVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  double dVar7;
  double *local_38;
  
  if (m != 0) {
    uVar3 = 0;
    local_38 = v;
    do {
      if (n != 0) {
        sVar5 = 0;
        lVar6 = 0;
        pdVar1 = local_38;
        uVar4 = uVar3;
        do {
          res[uVar4] = u[lVar6] * v[uVar4];
          lVar6 = lVar6 + 1;
          if (uVar4 + m < m * n) {
            dVar7 = res[uVar4];
            sVar2 = m;
            do {
              dVar7 = dVar7 + u[lVar6] * pdVar1[sVar2];
              res[uVar4] = dVar7;
              lVar6 = lVar6 + 1;
              sVar2 = sVar2 + m;
            } while (uVar4 + sVar2 < m * n);
          }
          sVar5 = sVar5 + 1;
          pdVar1 = pdVar1 + m;
          uVar4 = uVar4 + m;
        } while (sVar5 != n);
      }
      uVar3 = uVar3 + 1;
      local_38 = local_38 + 1;
    } while (uVar3 != m);
  }
  return;
}

Assistant:

void fsnav_linal_u_mul(double* res, double* u, double* v, const size_t n, const size_t m)
{
	size_t i, j, k, p, p0, mn;

	mn = m*n;
	for (j = 0; j < m; j++) {
		for (i = 0, k = 0, p0 = j; i < n; i++, p0 += m) {
			res[p0] = u[k]*v[p0];
			for (p = p0+m, k++; p < mn; p += m, k++)
				res[p0] += u[k]*v[p];
		}
	}
}